

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetIncludeDirectoriesCommand.cxx
# Opt level: O3

void __thiscall
cmTargetIncludeDirectoriesCommand::HandleInterfaceContent
          (cmTargetIncludeDirectoriesCommand *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool prepend,bool system)

{
  undefined7 in_register_00000081;
  string joined;
  string local_58;
  string local_38;
  
  cmTargetPropCommandBase::HandleInterfaceContent
            (&this->super_cmTargetPropCommandBase,tgt,content,prepend,false);
  if ((int)CONCAT71(in_register_00000081,system) != 0) {
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_38,content,";");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES","");
    cmTarget::AppendProperty(tgt,&local_58,local_38._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmTargetIncludeDirectoriesCommand
::HandleInterfaceContent(cmTarget *tgt,
                         const std::vector<std::string> &content,
                         bool prepend, bool system)
{
  cmTargetPropCommandBase::HandleInterfaceContent(tgt, content,
                                                  prepend, system);

  if (system)
    {
    std::string joined = cmJoin(content, ";");
    tgt->AppendProperty("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",
                        joined.c_str());
    }
}